

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynomial.c
# Opt level: O2

void polynomial_formal_derivative(field_t field,polynomial_t poly,polynomial_t der)

{
  ulong uVar1;
  ulong uVar2;
  field_element_t fVar3;
  
  memset(der.coeff,0,(ulong)(der.order + 1));
  uVar1 = 0;
  while ((uint)uVar1 <= der.order) {
    uVar2 = (ulong)((uint)uVar1 + 1);
    fVar3 = poly.coeff[uVar2];
    if ((uVar1 & 1) != 0) {
      fVar3 = '\0';
    }
    der.coeff[uVar1] = fVar3;
    uVar1 = uVar2;
  }
  return;
}

Assistant:

void polynomial_formal_derivative(field_t field, polynomial_t poly, polynomial_t der) {
    // if f(x) = a(n)*x^n + ... + a(1)*x + a(0)
    // then f'(x) = n*a(n)*x^(n-1) + ... + 2*a(2)*x + a(1)
    // where n*a(n) = sum(k=1, n, a(n)) e.g. the nth sum of a(n) in GF(2^8)

    // assumes der.order = poly.order - 1
    memset(der.coeff, 0, sizeof(field_element_t) * (der.order + 1));
    for (unsigned int i = 0; i <= der.order; i++) {
        // we're filling in the ith power of der, so we look ahead one power in poly
        // f(x) = a(i + 1)*x^(i + 1) -> f'(x) = (i + 1)*a(i + 1)*x^i
        // where (i + 1)*a(i + 1) is the sum of a(i + 1) (i + 1) times, not the product
        der.coeff[i] = field_sum(field, poly.coeff[i + 1], i + 1);
    }
}